

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_blockcb.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  
  rfc5444_reader_init(&reader);
  rfc5444_reader_add_packet_consumer(&reader,&consumer,consumer_entries,2);
  consumer.block_callback = cb_blocktlv_packet_okay;
  consumer.block_callback_failed_constraints = cb_blocktlv_packet_failed;
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_packet1");
  rfc5444_reader_handle_packet(&reader,testpacket1,5);
  cunit_named_check((_Bool)got_tlv_0,"test_packet1",0x87,"TLV 1");
  cunit_named_check((_Bool)(got_tlv_1 ^ 1),"test_packet1",0x88,"TLV 2");
  cunit_named_check((_Bool)(got_multiple_times_0 ^ 1),"test_packet1",0x8a,"TLV 1 (duplicate)");
  cunit_named_check((_Bool)(got_multiple_times_1 ^ 1),"test_packet1",0x8b,"TLV 2 (duplicate)");
  cunit_named_check(got_failed_constraints,"test_packet1",0x8d,"mandatory missing");
  cunit_end_test("test_packet1");
  cunit_start_test("test_packet12");
  rfc5444_reader_handle_packet(&reader,testpacket12,7);
  cunit_named_check((_Bool)got_tlv_0,"test_packet12",0x96,"TLV 1");
  cunit_named_check((_Bool)got_tlv_1,"test_packet12",0x97,"TLV 2");
  cunit_named_check((_Bool)(got_multiple_times_0 ^ 1),"test_packet12",0x99,"TLV 1 (duplicate)");
  cunit_named_check((_Bool)(got_multiple_times_1 ^ 1),"test_packet12",0x9a,"TLV 2 (duplicate)");
  cunit_named_check((_Bool)(got_failed_constraints ^ 1),"test_packet12",0x9c,"mandatory missing");
  cunit_end_test("test_packet12");
  cunit_start_test("test_packet121");
  rfc5444_reader_handle_packet(&reader,testpacket121,9);
  cunit_named_check((_Bool)got_tlv_0,"test_packet121",0xa5,"TLV 1");
  cunit_named_check((_Bool)got_tlv_1,"test_packet121",0xa6,"TLV 2");
  cunit_named_check((_Bool)got_multiple_times_0,"test_packet121",0xa8,"TLV 1 (duplicate)");
  cunit_named_check((_Bool)(got_multiple_times_1 ^ 1),"test_packet121",0xa9,"TLV 2 (duplicate)");
  cunit_named_check((_Bool)(got_failed_constraints ^ 1),"test_packet121",0xab,"mandatory missing");
  cunit_end_test("test_packet121");
  cunit_start_test("test_packet212");
  rfc5444_reader_handle_packet(&reader,testpacket212,9);
  cunit_named_check((_Bool)got_tlv_0,"test_packet212",0xb4,"TLV 1");
  cunit_named_check((_Bool)got_tlv_1,"test_packet212",0xb5,"TLV 2");
  cunit_named_check((_Bool)(got_multiple_times_0 ^ 1),"test_packet212",0xb7,"TLV 1 (duplicate)");
  cunit_named_check((_Bool)got_multiple_times_1,"test_packet212",0xb8,"TLV 2 (duplicate)");
  cunit_named_check((_Bool)(got_failed_constraints ^ 1),"test_packet212",0xba,"mandatory missing");
  cunit_end_test("test_packet212");
  rfc5444_reader_cleanup(&reader);
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  rfc5444_reader_init(&reader);
  rfc5444_reader_add_packet_consumer(&reader, &consumer, consumer_entries, ARRAYSIZE(consumer_entries));
  consumer.block_callback = cb_blocktlv_packet_okay;
  consumer.block_callback_failed_constraints = cb_blocktlv_packet_failed;

  BEGIN_TESTING(clear_elements);

  test_packet1();
  test_packet12();
  test_packet121();
  test_packet212();

  rfc5444_reader_cleanup(&reader);

  return FINISH_TESTING();
}